

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_trc.c
# Opt level: O0

void Curl_trc_cf_infof(Curl_easy *data,Curl_cfilter *cf,char *fmt,...)

{
  char in_AL;
  int iVar1;
  int iVar2;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_8f8 [24];
  undefined8 local_8e0;
  undefined8 local_8d8;
  undefined8 local_8d0;
  undefined8 local_8c8;
  undefined8 local_8b8;
  undefined8 local_8a8;
  undefined8 local_898;
  undefined8 local_888;
  undefined8 local_878;
  undefined8 local_868;
  undefined8 local_858;
  char local_848 [8];
  char buffer [2050];
  int local_3c;
  undefined1 local_38 [4];
  int len;
  va_list ap;
  char *fmt_local;
  Curl_cfilter *cf_local;
  Curl_easy *data_local;
  
  if (in_AL != '\0') {
    local_8c8 = in_XMM0_Qa;
    local_8b8 = in_XMM1_Qa;
    local_8a8 = in_XMM2_Qa;
    local_898 = in_XMM3_Qa;
    local_888 = in_XMM4_Qa;
    local_878 = in_XMM5_Qa;
    local_868 = in_XMM6_Qa;
    local_858 = in_XMM7_Qa;
  }
  if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0)) &&
      (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) &&
     ((cf != (Curl_cfilter *)0x0 && (0 < cf->cft->log_level)))) {
    local_3c = 0;
    local_8e0 = in_RCX;
    local_8d8 = in_R8;
    local_8d0 = in_R9;
    ap[0].reg_save_area = fmt;
    if ((data->state).feat != (curl_trc_feat *)0x0) {
      local_3c = curl_msnprintf(local_848,0x800,"[%s] ",((data->state).feat)->name);
    }
    if (cf->sockindex == 0) {
      iVar1 = curl_msnprintf(local_848 + local_3c,(long)(0x800 - local_3c),"[%s] ",cf->cft->name);
    }
    else {
      iVar1 = curl_msnprintf(local_848 + local_3c,(long)(0x800 - local_3c),"[%s-%d] ",cf->cft->name,
                             (ulong)(uint)cf->sockindex);
    }
    local_3c = iVar1 + local_3c;
    ap[0].overflow_arg_area = local_8f8;
    ap[0]._0_8_ = &stack0x00000008;
    len = 0x30;
    local_38 = (undefined1  [4])0x18;
    iVar1 = curl_mvsnprintf(local_848 + local_3c,(long)(0x800 - local_3c),
                            (char *)ap[0].reg_save_area,(__va_list_tag *)local_38);
    iVar2 = iVar1 + local_3c + 1;
    local_848[iVar1 + local_3c] = '\n';
    local_848[iVar2] = '\0';
    Curl_debug(data,CURLINFO_TEXT,local_848,(long)iVar2);
  }
  return;
}

Assistant:

void Curl_trc_cf_infof(struct Curl_easy *data, struct Curl_cfilter *cf,
                       const char *fmt, ...)
{
  DEBUGASSERT(cf);
  if(Curl_trc_cf_is_verbose(cf, data)) {
    va_list ap;
    int len = 0;
    char buffer[MAXINFO + 2];
    if(data->state.feat)
      len += msnprintf(buffer + len, MAXINFO - len, "[%s] ",
                       data->state.feat->name);
    if(cf->sockindex)
      len += msnprintf(buffer + len, MAXINFO - len, "[%s-%d] ",
                      cf->cft->name, cf->sockindex);
    else
      len += msnprintf(buffer + len, MAXINFO - len, "[%s] ", cf->cft->name);
    va_start(ap, fmt);
    len += mvsnprintf(buffer + len, MAXINFO - len, fmt, ap);
    va_end(ap);
    buffer[len++] = '\n';
    buffer[len] = '\0';
    Curl_debug(data, CURLINFO_TEXT, buffer, len);
  }
}